

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.c
# Opt level: O0

token * abstract_array_static_declarator(dmr_C *C,token *token,int *has_static)

{
  int *has_static_local;
  token *token_local;
  dmr_C *C_local;
  
  for (has_static_local = (int *)token; *(ident **)(has_static_local + 4) == C->S->static_ident;
      has_static_local = *(int **)(has_static_local + 2)) {
    if (*has_static != 0) {
      dmrC_sparse_error(C,*(position *)has_static_local,"duplicate array static declarator");
    }
    *has_static = 1;
  }
  return (token *)has_static_local;
}

Assistant:

static struct token *abstract_array_static_declarator(struct dmr_C *C, struct token *token, int *has_static)
{
	while (token->ident == C->S->static_ident) {
		if (*has_static)
			dmrC_sparse_error(C, token->pos, "duplicate array static declarator");

		*has_static = 1;
		token = token->next;
	}
	return token;

}